

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O3

bool spvtools::val::anon_unknown_0::GetImageTypeInfo
               (ValidationState_t *_,uint32_t id,ImageTypeInfo *info)

{
  pointer puVar1;
  uint uVar2;
  Instruction *pIVar3;
  ulong uVar4;
  uint16_t uVar5;
  AccessQualifier AVar6;
  
  if (info != (ImageTypeInfo *)0x0 && id != 0) {
    pIVar3 = ValidationState_t::FindDef(_,id);
    if (pIVar3 == (Instruction *)0x0) {
      __assert_fail("inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_image.cpp"
                    ,100,
                    "bool spvtools::val::(anonymous namespace)::GetImageTypeInfo(const ValidationState_t &, uint32_t, ImageTypeInfo *)"
                   );
    }
    uVar5 = (pIVar3->inst_).opcode;
    if (uVar5 == 0x1b) {
      pIVar3 = ValidationState_t::FindDef
                         (_,(pIVar3->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[2]);
      if (pIVar3 == (Instruction *)0x0) {
        __assert_fail("inst",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_image.cpp"
                      ,0x68,
                      "bool spvtools::val::(anonymous namespace)::GetImageTypeInfo(const ValidationState_t &, uint32_t, ImageTypeInfo *)"
                     );
      }
      uVar5 = (pIVar3->inst_).opcode;
    }
    if (uVar5 == 0x19) {
      puVar1 = (pIVar3->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(pIVar3->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
      if (uVar4 - 9 < 2) {
        info->sampled_type = puVar1[2];
        uVar2 = puVar1[4];
        info->dim = puVar1[3];
        info->depth = uVar2;
        info->arrayed = puVar1[5];
        info->multisampled = puVar1[6];
        info->sampled = puVar1[7];
        info->format = puVar1[8];
        AVar6 = Max;
        if (9 < uVar4) {
          AVar6 = puVar1[9];
        }
        info->access_qualifier = AVar6;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool GetImageTypeInfo(const ValidationState_t& _, uint32_t id,
                      ImageTypeInfo* info) {
  if (!id || !info) return false;

  const Instruction* inst = _.FindDef(id);
  assert(inst);

  if (inst->opcode() == spv::Op::OpTypeSampledImage) {
    inst = _.FindDef(inst->word(2));
    assert(inst);
  }

  if (inst->opcode() != spv::Op::OpTypeImage) return false;

  const size_t num_words = inst->words().size();
  if (num_words != 9 && num_words != 10) return false;

  info->sampled_type = inst->word(2);
  info->dim = static_cast<spv::Dim>(inst->word(3));
  info->depth = inst->word(4);
  info->arrayed = inst->word(5);
  info->multisampled = inst->word(6);
  info->sampled = inst->word(7);
  info->format = static_cast<spv::ImageFormat>(inst->word(8));
  info->access_qualifier =
      num_words < 10 ? spv::AccessQualifier::Max
                     : static_cast<spv::AccessQualifier>(inst->word(9));
  return true;
}